

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

unsigned_long __thiscall
ObjectFile::getUnsignedLongValue(ObjectFile *this,CK_ATTRIBUTE_TYPE type,unsigned_long val)

{
  OSAttribute *this_00;
  mapped_type *ppOVar1;
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *in_RDX;
  undefined8 in_RSI;
  OSAttribute *attr;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  key_type *in_stack_ffffffffffffffd8;
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *local_8;
  
  MutexLocker::MutexLocker
            ((MutexLocker *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  ppOVar1 = std::
            map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
            ::operator[](in_RDX,in_stack_ffffffffffffffd8);
  this_00 = *ppOVar1;
  if (this_00 == (OSAttribute *)0x0) {
    softHSMLog(3,"getUnsignedLongValue",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x93,"The attribute does not exist: 0x%08X",in_RSI);
    local_8 = in_RDX;
  }
  else {
    in_stack_ffffffffffffffa7 = OSAttribute::isUnsignedLongAttribute(this_00);
    if ((bool)in_stack_ffffffffffffffa7) {
      local_8 = (map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                 *)OSAttribute::getUnsignedLongValue(this_00);
    }
    else {
      softHSMLog(3,"getUnsignedLongValue",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0x9d,"The attribute is not an unsigned long: 0x%08X",in_RSI);
      local_8 = in_RDX;
    }
  }
  MutexLocker::~MutexLocker
            ((MutexLocker *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  return (unsigned_long)local_8;
}

Assistant:

unsigned long ObjectFile::getUnsignedLongValue(CK_ATTRIBUTE_TYPE type, unsigned long val)
{
	MutexLocker lock(objectMutex);

	OSAttribute* attr = attributes[type];
	if (attr == NULL)
	{
		ERROR_MSG("The attribute does not exist: 0x%08X", type);
		return val;
	}

	if (attr->isUnsignedLongAttribute())
	{
		return attr->getUnsignedLongValue();
	}
	else
	{
		ERROR_MSG("The attribute is not an unsigned long: 0x%08X", type);
		return val;
	}
}